

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

void __thiscall
ON_RTree::SplitNode(ON_RTree *this,ON_RTreeNode *a_node,ON_RTreeBranch *a_branch,
                   ON_RTreeNode **a_newNode)

{
  undefined8 *puVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  double dVar13;
  int index;
  long lVar14;
  ON_RTreeNode *a_nodeB;
  int iVar15;
  ON_RTreeBBox *pOVar16;
  ulong uVar17;
  ulong uVar18;
  ON_RTreeBBox *a_rectB;
  int indexB;
  uint a_group;
  ulong uVar19;
  ulong uVar20;
  int index_1;
  ulong uVar21;
  double local_368;
  ON_RTreeBBox local_348;
  double area [7];
  ON_RTreePartitionVars localVars;
  
  iVar2 = a_node->m_level;
  for (lVar14 = 0xb8; lVar14 != 0x208; lVar14 = lVar14 + 0x38) {
    *(undefined8 *)((long)localVars.m_taken + lVar14 + 0xc) =
         *(undefined8 *)((long)a_node + lVar14 + -0x80);
    puVar1 = (undefined8 *)((long)a_node + lVar14 + -0xb0);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    puVar1 = (undefined8 *)((long)a_node + lVar14 + -0xa0);
    uVar10 = *puVar1;
    uVar11 = puVar1[1];
    puVar1 = (undefined8 *)((long)a_node + lVar14 + -0x90);
    uVar12 = puVar1[1];
    *(undefined8 *)((long)localVars.m_taken + lVar14 + -4) = *puVar1;
    *(undefined8 *)((long)localVars.m_taken + lVar14 + 4) = uVar12;
    *(undefined8 *)((long)localVars.m_partition + lVar14 + 0x10) = uVar10;
    *(undefined8 *)((long)localVars.m_partition + lVar14 + 0x18) = uVar11;
    *(undefined8 *)((long)localVars.m_partition + lVar14) = uVar8;
    *(undefined8 *)((long)localVars.m_partition + lVar14 + 8) = uVar9;
  }
  localVars.m_branchBuf[6].field_1 = a_branch->field_1;
  localVars.m_branchBuf[6].m_rect.m_min[0] = (a_branch->m_rect).m_min[0];
  localVars.m_branchBuf[6].m_rect.m_min[1] = (a_branch->m_rect).m_min[1];
  localVars.m_branchBuf[6].m_rect.m_min[2] = (a_branch->m_rect).m_min[2];
  localVars.m_branchBuf[6].m_rect.m_max[0] = (a_branch->m_rect).m_max[0];
  localVars.m_branchBuf[6].m_rect.m_max[1] = (a_branch->m_rect).m_max[1];
  localVars.m_branchBuf[6].m_rect.m_max[2] = (a_branch->m_rect).m_max[2];
  localVars.m_branchCount = 7;
  localVars.m_coverSplit.m_min[0] = localVars.m_branchBuf[0].m_rect.m_min[0];
  localVars.m_coverSplit.m_min[1] = localVars.m_branchBuf[0].m_rect.m_min[1];
  localVars.m_coverSplit.m_min[2] = localVars.m_branchBuf[0].m_rect.m_min[2];
  localVars.m_coverSplit.m_max[0] = localVars.m_branchBuf[0].m_rect.m_max[0];
  localVars.m_coverSplit.m_max[1] = localVars.m_branchBuf[0].m_rect.m_max[1];
  localVars.m_coverSplit.m_max[2] = localVars.m_branchBuf[0].m_rect.m_max[2];
  for (lVar14 = 0xf0; lVar14 != 0x240; lVar14 = lVar14 + 0x38) {
    CombineRectHelper((ON_RTreeBBox *)area,&localVars.m_coverSplit,
                      (ON_RTreeBBox *)((long)localVars.m_partition + lVar14));
    localVars.m_coverSplit.m_min[0] = area[0];
    localVars.m_coverSplit.m_min[1] = area[1];
    localVars.m_coverSplit.m_min[2] = area[2];
    localVars.m_coverSplit.m_max[0] = area[3];
    localVars.m_coverSplit.m_max[1] = area[4];
    localVars.m_coverSplit.m_max[2] = area[5];
  }
  local_368 = (localVars.m_coverSplit.m_max[2] - localVars.m_coverSplit.m_min[2]) *
              (localVars.m_coverSplit.m_max[2] - localVars.m_coverSplit.m_min[2]) +
              (localVars.m_coverSplit.m_max[1] - localVars.m_coverSplit.m_min[1]) *
              (localVars.m_coverSplit.m_max[1] - localVars.m_coverSplit.m_min[1]) +
              (localVars.m_coverSplit.m_max[0] - localVars.m_coverSplit.m_min[0]) *
              (localVars.m_coverSplit.m_max[0] - localVars.m_coverSplit.m_min[0]);
  a_node->m_level = -1;
  a_node->m_count = 0;
  localVars.m_count[0] = 0;
  localVars.m_count[1] = 0;
  localVars.m_area[0] = 0.0;
  localVars.m_area[1] = 0.0;
  localVars.m_total = 7;
  localVars.m_minFill = 2;
  for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
    localVars.m_taken[lVar14] = 0;
    localVars.m_partition[lVar14] = -1;
  }
  pOVar16 = &localVars.m_branchBuf[0].m_rect;
  localVars.m_coverSplitArea = local_368;
  for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
    dVar4 = CalcRectVolumeHelper(pOVar16);
    area[lVar14] = dVar4;
    pOVar16 = (ON_RTreeBBox *)(pOVar16[1].m_min + 1);
  }
  local_368 = -1.0 - local_368;
  uVar17 = 1;
  uVar20 = 1;
  pOVar16 = &localVars.m_branchBuf[1].m_rect;
  uVar18 = 0;
  for (uVar21 = 0; uVar21 != 6; uVar21 = uVar21 + 1) {
    a_rectB = pOVar16;
    for (uVar19 = uVar20; (int)uVar19 < 7; uVar19 = uVar19 + 1) {
      CombineRectHelper(&local_348,&localVars.m_branchBuf[uVar21].m_rect,a_rectB);
      dVar4 = (((local_348.m_max[2] - local_348.m_min[2]) *
                (local_348.m_max[2] - local_348.m_min[2]) +
               (local_348.m_max[1] - local_348.m_min[1]) * (local_348.m_max[1] - local_348.m_min[1])
               + (local_348.m_max[0] - local_348.m_min[0]) *
                 (local_348.m_max[0] - local_348.m_min[0])) - area[uVar21]) - area[uVar19];
      if (local_368 < dVar4) {
        uVar17 = uVar19;
      }
      uVar17 = uVar17 & 0xffffffff;
      if (local_368 < dVar4) {
        uVar18 = uVar21 & 0xffffffff;
        local_368 = dVar4;
      }
      a_rectB = (ON_RTreeBBox *)(a_rectB[1].m_min + 1);
    }
    uVar20 = uVar20 + 1;
    pOVar16 = (ON_RTreeBBox *)((anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *)pOVar16[1].m_min + 1)
    ;
  }
  ClassifyHelper((int)uVar18,0,&localVars);
  ClassifyHelper((int)uVar17,1,&localVars);
  while( true ) {
    dVar13 = localVars.m_area[1];
    dVar4 = localVars.m_area[0];
    if (localVars.m_total <= localVars.m_count[1] + localVars.m_count[0]) goto LAB_005b39c2;
    iVar15 = localVars.m_total - localVars.m_minFill;
    if ((iVar15 <= localVars.m_count[0]) || (iVar15 <= localVars.m_count[1])) break;
    uVar20 = 0;
    uVar17 = localVars._28_8_ & 0xffffffff;
    if (localVars.m_total < 1) {
      uVar17 = uVar20;
    }
    pOVar16 = &localVars.m_branchBuf[0].m_rect;
    uVar21 = 0;
    uVar18 = 0;
    dVar7 = -1.0;
    for (; a_group = (uint)uVar21, uVar17 != uVar20; uVar20 = uVar20 + 1) {
      if (localVars.m_taken[uVar20] == 0) {
        CombineRectHelper((ON_RTreeBBox *)area,pOVar16,localVars.m_cover);
        CombineRectHelper(&local_348,pOVar16,localVars.m_cover + 1);
        dVar5 = (((local_348.m_max[2] - local_348.m_min[2]) *
                  (local_348.m_max[2] - local_348.m_min[2]) +
                 (local_348.m_max[1] - local_348.m_min[1]) *
                 (local_348.m_max[1] - local_348.m_min[1]) +
                 (local_348.m_max[0] - local_348.m_min[0]) *
                 (local_348.m_max[0] - local_348.m_min[0])) - dVar13) +
                (dVar4 - ((area[5] - area[2]) * (area[5] - area[2]) +
                         (area[4] - area[1]) * (area[4] - area[1]) +
                         (area[3] - area[0]) * (area[3] - area[0])));
        bVar3 = dVar5 < -dVar5;
        dVar6 = -dVar5;
        if (!bVar3) {
          dVar6 = dVar5;
        }
        if (dVar6 <= dVar7) {
          if (((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) &&
             (localVars.m_count[dVar5 < 0.0] < localVars.m_count[uVar21])) {
            uVar18 = uVar20 & 0xffffffff;
            a_group = (uint)bVar3;
          }
        }
        else {
          uVar18 = uVar20 & 0xffffffff;
          a_group = (uint)bVar3;
          dVar7 = dVar6;
        }
        uVar21 = (ulong)a_group;
      }
      pOVar16 = (ON_RTreeBBox *)(pOVar16[1].m_min + 1);
    }
    ClassifyHelper((int)uVar18,a_group,&localVars);
  }
  bVar3 = iVar15 <= localVars.m_count[0];
  iVar15 = localVars.m_total;
  for (lVar14 = 0; lVar14 < iVar15; lVar14 = lVar14 + 1) {
    if (localVars.m_taken[lVar14] == 0) {
      ClassifyHelper((int)lVar14,(uint)bVar3,&localVars);
      iVar15 = localVars.m_total;
    }
  }
LAB_005b39c2:
  a_nodeB = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
  *a_newNode = a_nodeB;
  a_node->m_level = iVar2;
  a_nodeB->m_level = iVar2;
  LoadNodes(this,a_node,a_nodeB,&localVars);
  return;
}

Assistant:

void ON_RTree::SplitNode(ON_RTreeNode* a_node, ON_RTreeBranch* a_branch, ON_RTreeNode** a_newNode)
{
  ON_RTreePartitionVars localVars;
  int level;

  // Load all the branches into a buffer, initialize a_node to be empty
  level = a_node->m_level; // save m_level (The InitNode() call in GetBranches will set it to -1)
  GetBranches(a_node, a_branch, &localVars);

  // Find partition
  ChoosePartition(&localVars, ON_RTree_MIN_NODE_COUNT);

  // Put branches from buffer into 2 nodes according to chosen partition
  *a_newNode = m_mem_pool.AllocNode();
  (*a_newNode)->m_level = a_node->m_level = level; // restore m_level
  LoadNodes(a_node, *a_newNode, &localVars);
}